

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

void __thiscall spirv_cross::CompilerMSL::localize_global_variables(CompilerMSL *this)

{
  SmallVector<unsigned_int,_8UL> *this_00;
  VariableID id;
  StorageClass SVar1;
  bool bVar2;
  SPIRFunction *this_01;
  uint *puVar3;
  SPIRVariable *var;
  uint *itr;
  
  this_01 = Compiler::get<spirv_cross::SPIRFunction>
                      ((Compiler *)this,
                       (this->super_CompilerGLSL).super_Compiler.ir.default_entry_point.id);
  this_00 = &(this->super_CompilerGLSL).super_Compiler.global_variables;
  puVar3 = (this->super_CompilerGLSL).super_Compiler.global_variables.super_VectorView<unsigned_int>
           .ptr;
  itr = puVar3;
  do {
    if (itr == puVar3 + (this->super_CompilerGLSL).super_Compiler.global_variables.
                        super_VectorView<unsigned_int>.buffer_size) {
      return;
    }
    id.id = *itr;
    var = Compiler::get<spirv_cross::SPIRVariable>((Compiler *)this,id.id);
    SVar1 = var->storage;
    if (SVar1 == StorageClassOutput) {
      bVar2 = is_mesh_shader(this);
      if (bVar2) {
LAB_001cafaf:
        SPIRFunction::add_local_variable(this_01,id);
        goto LAB_001cafb9;
      }
LAB_001cafc9:
      itr = itr + 1;
    }
    else {
      if (((SVar1 != StorageClassWorkgroup) && (SVar1 != StorageClassTaskPayloadWorkgroupEXT)) &&
         (SVar1 != StorageClassPrivate)) goto LAB_001cafc9;
      bVar2 = CompilerGLSL::variable_is_lut(&this->super_CompilerGLSL,var);
      if (!bVar2) goto LAB_001cafaf;
LAB_001cafb9:
      itr = SmallVector<unsigned_int,_8UL>::erase(this_00,itr);
    }
    puVar3 = (this_00->super_VectorView<unsigned_int>).ptr;
  } while( true );
}

Assistant:

void CompilerMSL::localize_global_variables()
{
	auto &entry_func = get<SPIRFunction>(ir.default_entry_point);
	auto iter = global_variables.begin();
	while (iter != global_variables.end())
	{
		uint32_t v_id = *iter;
		auto &var = get<SPIRVariable>(v_id);
		if (var.storage == StorageClassPrivate || var.storage == StorageClassWorkgroup ||
		    var.storage == StorageClassTaskPayloadWorkgroupEXT)
		{
			if (!variable_is_lut(var))
				entry_func.add_local_variable(v_id);
			iter = global_variables.erase(iter);
		}
		else if (var.storage == StorageClassOutput && is_mesh_shader())
		{
			entry_func.add_local_variable(v_id);
			iter = global_variables.erase(iter);
		}
		else
			iter++;
	}
}